

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

uint __thiscall
MovParsedH264TrackData::newBufferSize(MovParsedH264TrackData *this,uint8_t *buff,uint size)

{
  bool bVar1;
  uint uVar2;
  uint8_t *puVar3;
  ostream *poVar4;
  int64_t iVar5;
  VodCoreException *pVVar6;
  reference this_00;
  size_type sVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *i;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__range1;
  uint spsPpsSize;
  ostringstream local_358 [8];
  ostringstream ss_1;
  uint32_t nalSize;
  ostringstream local_1a8 [8];
  ostringstream ss;
  int local_2c;
  uint nalCnt;
  uint8_t *end;
  uint8_t *puStack_18;
  uint size_local;
  uint8_t *buff_local;
  MovParsedH264TrackData *this_local;
  
  puVar3 = buff + size;
  local_2c = 0;
  puStack_18 = buff;
  while( true ) {
    if (puVar3 <= puStack_18) {
      __range1._0_4_ = 0;
      __end1 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::begin(&this->spsPpsList);
      i = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::end(&this->spsPpsList);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                    *)&i);
        if (!bVar1) break;
        this_00 = __gnu_cxx::
                  __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::operator*(&__end1);
        sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
        __range1._0_4_ = (int)sVar7 + 4 + (int)__range1;
        __gnu_cxx::
        __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator++(&__end1);
      }
      return size + (int)__range1 + local_2c * (4 - (uint)this->nal_length_size);
    }
    if (puVar3 < puStack_18 + (int)(uint)this->nal_length_size) break;
    uVar2 = getNalSize(this,puStack_18);
    if (puVar3 < puStack_18 + (ulong)uVar2 + (long)(int)(uint)this->nal_length_size) {
      std::__cxx11::ostringstream::ostringstream(local_358);
      poVar4 = std::operator<<((ostream *)local_358,
                               "MP4/MOV error: Invalid H.264/AVC frame at position ");
      iVar5 = IOContextDemuxer::getProcessedBytes(&this->m_demuxer->super_IOContextDemuxer);
      std::ostream::operator<<(poVar4,iVar5);
      pVVar6 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar6,0x3b6,(string *)&spsPpsSize);
      __cxa_throw(pVVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    puStack_18 = puStack_18 + (ulong)uVar2 + (long)(int)(uint)this->nal_length_size;
    local_2c = local_2c + 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar4 = std::operator<<((ostream *)local_1a8,
                           "MP4/MOV error: Invalid H.264/AVC frame at position ");
  iVar5 = IOContextDemuxer::getProcessedBytes(&this->m_demuxer->super_IOContextDemuxer);
  std::ostream::operator<<(poVar4,iVar5);
  pVVar6 = (VodCoreException *)__cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  VodCoreException::VodCoreException(pVVar6,0x3b6,(string *)&nalSize);
  __cxa_throw(pVVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

unsigned newBufferSize(uint8_t* buff, const unsigned size) override
    {
        const uint8_t* end = buff + size;
        unsigned nalCnt = 0;
        while (buff < end)
        {
            if (buff + nal_length_size > end)
                THROW(ERR_MOV_PARSE,
                      "MP4/MOV error: Invalid H.264/AVC frame at position " << m_demuxer->getProcessedBytes())
            const uint32_t nalSize = getNalSize(buff);
            buff += nal_length_size;
            if (buff + nalSize > end)
                THROW(ERR_MOV_PARSE,
                      "MP4/MOV error: Invalid H.264/AVC frame at position " << m_demuxer->getProcessedBytes())
            buff += nalSize;
            ++nalCnt;
        }
        unsigned spsPpsSize = 0;
        for (auto& i : spsPpsList) spsPpsSize += static_cast<uint32_t>(i.size() + 4);

        return size + spsPpsSize + nalCnt * (4 - nal_length_size);
    }